

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O1

bool __thiscall cmVSLink::Parse(cmVSLink *this,const_iterator argBeg,const_iterator argEnd)

{
  string *__rhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s1;
  pointer pcVar2;
  cmVSLink *pcVar3;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  int iVar4;
  ostream *poVar5;
  cmVSLink *pcVar6;
  bool bVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string intDir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  cmVSLink *local_68;
  undefined1 *local_60;
  long local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  string *local_40;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_38;
  
  local_60 = &local_50;
  local_58 = 0;
  local_50 = 0;
  local_68 = this;
  if (argBeg._M_current != argEnd._M_current) {
    do {
      if (*((argBeg._M_current)->_M_dataplus)._M_p != '-') break;
      iVar4 = std::__cxx11::string::compare((char *)argBeg._M_current);
      if (iVar4 == 0) {
        argBeg._M_current = argBeg._M_current + 1;
        break;
      }
      iVar4 = std::__cxx11::string::compare((char *)argBeg._M_current);
      if (iVar4 == 0) {
        while ((argBeg._M_current = argBeg._M_current + 1, argBeg._M_current != argEnd._M_current &&
               (*((argBeg._M_current)->_M_dataplus)._M_p != '-'))) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->UserManifests,argBeg._M_current);
        }
      }
      else {
        iVar4 = strncmp(((argBeg._M_current)->_M_dataplus)._M_p,"--intdir=",9);
        if (iVar4 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"unknown argument \'",0x12);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,((argBeg._M_current)->_M_dataplus)._M_p,
                              (argBeg._M_current)->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'\n",2);
          goto LAB_00229090;
        }
        std::__cxx11::string::substr((ulong)&local_88,(ulong)argBeg._M_current);
        std::__cxx11::string::operator=((string *)&local_60,(string *)&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        argBeg._M_current = argBeg._M_current + 1;
      }
    } while (argBeg._M_current != argEnd._M_current);
  }
  pcVar6 = local_68;
  bVar7 = false;
  if ((local_58 != 0) && (argBeg._M_current != argEnd._M_current)) {
    local_38 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &local_68->LinkCommand;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (local_38,(local_68->LinkCommand).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,argBeg._M_current,
               argEnd._M_current);
    if (argBeg._M_current != argEnd._M_current) {
      local_40 = (string *)&pcVar6->TargetFile;
      do {
        iVar4 = cmsys::SystemTools::Strucmp
                          (((argBeg._M_current)->_M_dataplus)._M_p,"/INCREMENTAL:YES");
        if ((iVar4 == 0) ||
           (iVar4 = cmsys::SystemTools::Strucmp
                              (((argBeg._M_current)->_M_dataplus)._M_p,"/INCREMENTAL"), iVar4 == 0))
        {
          pcVar6->Incremental = true;
        }
        else {
          iVar4 = cmsys::SystemTools::Strucmp
                            (((argBeg._M_current)->_M_dataplus)._M_p,"/MANIFEST:NO");
          if (iVar4 == 0) {
            pcVar6->LinkGeneratesManifest = false;
          }
          else {
            __s1 = ((argBeg._M_current)->_M_dataplus)._M_p;
            iVar4 = strncmp(__s1,"/Fe",3);
            if (iVar4 == 0) {
              std::__cxx11::string::substr((ulong)&local_88,(ulong)argBeg._M_current);
              std::__cxx11::string::operator=(local_40,(string *)&local_88);
              pcVar6 = local_68;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) {
LAB_00228dee:
                operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1
                               );
              }
            }
            else {
              iVar4 = strncmp(__s1,"/out:",5);
              pcVar6 = local_68;
              if (iVar4 == 0) {
                std::__cxx11::string::substr((ulong)&local_88,(ulong)argBeg._M_current);
                std::__cxx11::string::operator=(local_40,(string *)&local_88);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_88._M_dataplus._M_p != &local_88.field_2) goto LAB_00228dee;
              }
            }
          }
        }
        argBeg._M_current = argBeg._M_current + 1;
      } while (argBeg._M_current != argEnd._M_current);
    }
    if ((pcVar6->TargetFile)._M_string_length == 0) {
LAB_00229090:
      bVar7 = false;
    }
    else {
      paVar1 = &local_88.field_2;
      local_88._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_60,local_60 + local_58);
      std::__cxx11::string::append((char *)&local_88);
      std::__cxx11::string::operator=((string *)&pcVar6->ManifestFile,(string *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      local_88._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_60,local_60 + local_58);
      std::__cxx11::string::append((char *)&local_88);
      __rhs = &local_68->LinkerManifestFile;
      std::__cxx11::string::operator=((string *)__rhs,(string *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      pcVar3 = local_68;
      if (local_68->Incremental == true) {
        local_88._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_60,local_60 + local_58);
        std::__cxx11::string::append((char *)&local_88);
        std::__cxx11::string::operator=((string *)&pcVar3->ManifestFileRC,(string *)&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar1) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        local_88._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_60,local_60 + local_58);
        std::__cxx11::string::append((char *)&local_88);
        std::__cxx11::string::operator=((string *)&local_68->ManifestFileRes,(string *)&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar1) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
      }
      else if ((local_68->UserManifests).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               (local_68->UserManifests).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
        pcVar2 = (local_68->TargetFile)._M_dataplus._M_p;
        local_88._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,pcVar2,pcVar2 + (local_68->TargetFile)._M_string_length);
        std::__cxx11::string::append((char *)&local_88);
        std::__cxx11::string::operator=((string *)&pcVar6->ManifestFile,(string *)&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar1) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_assign((string *)__rhs);
      }
      bVar7 = true;
      if (local_68->LinkGeneratesManifest == true) {
        local_88._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"/MANIFEST","");
        this_00 = local_38;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_38,&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar1) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_88,"/MANIFESTFILE:",__rhs);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(this_00,&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar1) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  return bVar7;
}

Assistant:

bool cmVSLink::Parse(std::vector<std::string>::const_iterator argBeg,
                     std::vector<std::string>::const_iterator argEnd)
{
  // Parse our own arguments.
  std::string intDir;
  std::vector<std::string>::const_iterator arg = argBeg;
  while (arg != argEnd && cmHasLiteralPrefix(*arg, "-"))
    {
    if (*arg == "--")
      {
      ++arg;
      break;
      }
    else if (*arg == "--manifests")
      {
      for (++arg; arg != argEnd && !cmHasLiteralPrefix(*arg, "-"); ++arg)
        {
        this->UserManifests.push_back(*arg);
        }
      }
    else if (cmHasLiteralPrefix(*arg, "--intdir="))
      {
      intDir = arg->substr(9);
      ++arg;
      }
    else
      {
      std::cerr << "unknown argument '" << *arg << "'\n";
      return false;
      }
    }
  if (intDir.empty())
    {
    return false;
    }

  // The rest of the arguments form the link command.
  if (arg == argEnd)
    {
    return false;
    }
  this->LinkCommand.insert(this->LinkCommand.begin(), arg, argEnd);

  // Parse the link command to extract information we need.
  for (; arg != argEnd; ++arg)
    {
    if (cmSystemTools::Strucmp(arg->c_str(), "/INCREMENTAL:YES") == 0)
      {
      this->Incremental = true;
      }
    else if (cmSystemTools::Strucmp(arg->c_str(), "/INCREMENTAL") == 0)
      {
      this->Incremental = true;
      }
    else if (cmSystemTools::Strucmp(arg->c_str(), "/MANIFEST:NO") == 0)
      {
      this->LinkGeneratesManifest = false;
      }
    else if (cmHasLiteralPrefix(*arg, "/Fe"))
      {
      this->TargetFile = arg->substr(3);
      }
    else if (cmHasLiteralPrefix(*arg, "/out:"))
      {
      this->TargetFile = arg->substr(5);
      }
    }

  if (this->TargetFile.empty())
    {
    return false;
    }

  this->ManifestFile = intDir + "/embed.manifest";
  this->LinkerManifestFile = intDir + "/intermediate.manifest";

  if (this->Incremental)
    {
    // We will compile a resource containing the manifest and
    // pass it to the link command.
    this->ManifestFileRC = intDir + "/manifest.rc";
    this->ManifestFileRes = intDir + "/manifest.res";
    }
  else if (this->UserManifests.empty())
    {
    // Prior to support for user-specified manifests CMake placed the
    // linker-generated manifest next to the binary (as if it were not to be
    // embedded) when not linking incrementally.  Preserve this behavior.
    this->ManifestFile = this->TargetFile + ".manifest";
    this->LinkerManifestFile = this->ManifestFile;
    }

  if (this->LinkGeneratesManifest)
    {
    this->LinkCommand.push_back("/MANIFEST");
    this->LinkCommand.push_back("/MANIFESTFILE:" + this->LinkerManifestFile);
    }

  return true;
}